

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_win_unpart(ggml_context *ctx,ggml_tensor *a,int w0,int h0,int w)

{
  ggml_tensor *tensor;
  int32_t params [1];
  int64_t ne [4];
  
  if (a->type == GGML_TYPE_F32) {
    ne[0] = a->ne[0];
    ne[1] = (int64_t)w0;
    ne[2] = (int64_t)h0;
    ne[3] = 1;
    tensor = ggml_new_tensor(ctx,GGML_TYPE_F32,3,ne);
    params[0] = w;
    ggml_set_op_params(tensor,params,4);
    tensor->op = GGML_OP_WIN_UNPART;
    tensor->src[0] = a;
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x1224,
             "GGML_ASSERT(%s) failed","a->type == GGML_TYPE_F32");
}

Assistant:

struct ggml_tensor * ggml_win_unpart(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   w0,
        int                   h0,
        int                   w) {
    GGML_ASSERT(a->type == GGML_TYPE_F32);

    const int64_t ne[4] = { a->ne[0], w0, h0, 1, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 3, ne);

    int32_t params[] = { w };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_WIN_UNPART;
    result->src[0] = a;

    return result;
}